

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_3dc0d::phase_1_commitment
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          limbo_instance_t *instance,limbo_salt_t *salt,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *witness_out,
          vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          *commitments,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *witness_deltas,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *mult_deltas,
          vector<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
          *output_broadcasts)

{
  BitSequence *pBVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  ulong uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *pvVar7;
  uint capacity;
  uint rate;
  ulong uVar8;
  long lVar9;
  hash_context ctx;
  allocator_type local_169;
  ulong local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_160;
  limbo_instance_t *local_158;
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *local_150;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_148;
  Keccak_HashInstance local_140;
  
  local_169 = (allocator_type)0x1;
  if (instance->digest_size == 0x20) {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  local_160 = __return_storage_ptr__;
  local_150 = commitments;
  local_148 = witness_deltas;
  Keccak_HashInitialize(&local_140,rate,capacity,0,'\x1f');
  Keccak_HashUpdate(&local_140,(BitSequence *)&local_169,8);
  Keccak_HashUpdate(&local_140,salt->_M_elems,0x100);
  pBVar1 = (witness_out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Keccak_HashUpdate(&local_140,pBVar1,
                    ((long)(witness_out->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) * 8);
  if (instance->num_rounds != 0) {
    local_168 = 0;
    local_158 = instance;
    do {
      pvVar7 = local_150;
      uVar5 = local_168;
      if (local_158->num_MPC_parties != 0) {
        lVar9 = 8;
        uVar8 = 0;
        do {
          lVar2 = *(long *)&(pvVar7->
                            super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar5].
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          pBVar1 = *(BitSequence **)(lVar2 + -8 + lVar9);
          Keccak_HashUpdate(&local_140,pBVar1,(*(long *)(lVar2 + lVar9) - (long)pBVar1) * 8);
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x18;
        } while (uVar8 < local_158->num_MPC_parties);
      }
      uVar5 = local_168;
      pvVar3 = (output_broadcasts->
               super__Vector_base<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pBVar1 = *(BitSequence **)
                &pvVar3[local_168].
                 super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
                 ._M_impl.super__Vector_impl_data;
      Keccak_HashUpdate(&local_140,pBVar1,
                        ((long)*(pointer *)
                                ((long)&pvVar3[local_168].
                                        super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - (long)pBVar1) * 8);
      pvVar4 = (local_148->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pBVar1 = pvVar4[uVar5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Keccak_HashUpdate(&local_140,pBVar1,
                        ((long)*(pointer *)
                                ((long)&pvVar4[uVar5].
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + 8) - (long)pBVar1) * 8);
      pvVar4 = (mult_deltas->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pBVar1 = pvVar4[uVar5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Keccak_HashUpdate(&local_140,pBVar1,
                        ((long)*(pointer *)
                                ((long)&pvVar4[uVar5].
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + 8) - (long)pBVar1) * 8);
      local_168 = uVar5 + 1;
      instance = local_158;
    } while (local_168 < local_158->num_rounds);
  }
  Keccak_HashFinal(&local_140,(BitSequence *)0x0);
  pvVar6 = local_160;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_160,(ulong)instance->digest_size,&local_169);
  pBVar1 = (pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Keccak_HashSqueeze(&local_140,pBVar1,
                     ((long)(pvVar6->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) * 8);
  return pvVar6;
}

Assistant:

std::vector<uint8_t> phase_1_commitment(
    const limbo_instance_t &instance, const limbo_salt_t &salt,
    const std::vector<uint8_t> &witness_out,
    const std::vector<std::vector<std::vector<uint8_t>>> &commitments,
    const std::vector<std::vector<uint8_t>> &witness_deltas,
    const std::vector<std::vector<uint8_t>> &mult_deltas,
    std::vector<std::vector<std::array<uint64_t, PARTY64>>>
        &output_broadcasts) {

  hash_context ctx;
  hash_init_prefix(&ctx, instance.digest_size, HASH_PREFIX_1);
  hash_update(&ctx, salt.data(), salt.size());
  hash_update(&ctx, witness_out.data(), witness_out.size());

  for (size_t repetition = 0; repetition < instance.num_rounds; repetition++) {
    for (size_t party = 0; party < instance.num_MPC_parties; party++) {
      hash_update(&ctx, commitments[repetition][party].data(),
                  commitments[repetition][party].size());
    }
    // dirty hack, need to check
    hash_update(&ctx, (uint8_t *)output_broadcasts[repetition].data(),
                PARTY64 * output_broadcasts[repetition].size() * 8);
    hash_update(&ctx, witness_deltas[repetition].data(),
                witness_deltas[repetition].size());
    hash_update(&ctx, mult_deltas[repetition].data(),
                mult_deltas[repetition].size());
  }
  hash_final(&ctx);

  std::vector<uint8_t> commitment(instance.digest_size);
  hash_squeeze(&ctx, commitment.data(), commitment.size());
  return commitment;
}